

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

QString * __thiscall
QAccessibleComboBox::localizedActionDescription
          (QString *__return_storage_ptr__,QAccessibleComboBox *this,QString *actionName)

{
  long lVar1;
  char cVar2;
  long lVar3;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  
  lVar3 = QAccessibleActionInterface::showMenuAction();
  lVar1 = (actionName->d).size;
  if (lVar1 == *(long *)(lVar3 + 0x10)) {
    QVar4.m_data = (actionName->d).ptr;
    QVar4.m_size = lVar1;
    QVar6.m_data = *(storage_type_conflict **)(lVar3 + 8);
    QVar6.m_size = lVar1;
    cVar2 = QtPrivate::equalStrings(QVar4,QVar6);
    if (cVar2 == '\0') goto LAB_00515c09;
LAB_00515c2c:
    QMetaObject::tr((char *)__return_storage_ptr__,(char *)&QComboBox::staticMetaObject,0x6e9bbc);
  }
  else {
LAB_00515c09:
    lVar3 = QAccessibleActionInterface::pressAction();
    lVar1 = (actionName->d).size;
    if (lVar1 == *(long *)(lVar3 + 0x10)) {
      QVar5.m_data = (actionName->d).ptr;
      QVar5.m_size = lVar1;
      QVar7.m_data = *(storage_type_conflict **)(lVar3 + 8);
      QVar7.m_size = lVar1;
      cVar2 = QtPrivate::equalStrings(QVar5,QVar7);
      if (cVar2 != '\0') goto LAB_00515c2c;
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAccessibleComboBox::localizedActionDescription(const QString &actionName) const
{
    if (actionName == showMenuAction() || actionName == pressAction())
        return QComboBox::tr("Open the combo box selection popup");
    return QString();
}